

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptAsyncFunction.cpp
# Opt level: O0

bool Js::VarIsImpl<Js::JavascriptAsyncSpawnStepFunction>(RecyclableObject *obj)

{
  bool bVar1;
  undefined1 local_12;
  undefined1 local_11;
  RecyclableObject *obj_local;
  
  bVar1 = VarIs<Js::JavascriptFunction,Js::RecyclableObject>(obj);
  local_11 = false;
  if (bVar1) {
    bVar1 = VirtualTableInfo<Js::JavascriptAsyncSpawnStepFunction>::HasVirtualTable(obj);
    local_12 = true;
    if (!bVar1) {
      local_12 = VirtualTableInfo<Js::CrossSiteObject<Js::JavascriptAsyncSpawnStepFunction>_>::
                 HasVirtualTable(obj);
    }
    local_11 = local_12;
  }
  return local_11;
}

Assistant:

bool Js::VarIsImpl<JavascriptAsyncSpawnStepFunction>(RecyclableObject* obj)
{
    return VarIs<JavascriptFunction>(obj) && (
        VirtualTableInfo<JavascriptAsyncSpawnStepFunction>::HasVirtualTable(obj) ||
        VirtualTableInfo<CrossSiteObject<JavascriptAsyncSpawnStepFunction>>::HasVirtualTable(obj)
    );
}